

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O3

void Lpk_NodeCutsOne(Lpk_Man_t *p,Lpk_Cut_t *pCut,int Node)

{
  int *__dest;
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  Abc_Obj_t *p_00;
  void *pvVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  Lpk_Cut_t *pCut_00;
  
  if (((undefined1  [212])*pCut & (undefined1  [212])0xfc0) != (undefined1  [212])0x600) {
    if ((Node < 0) || (pVVar3 = p->pNtk->vObjs, pVVar3->nSize <= Node)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    p_00 = (Abc_Obj_t *)pVVar3->pArray[(uint)Node];
    uVar5 = *(uint *)&p_00->field_0x14 & 0xf;
    if ((uVar5 != 2) && (uVar5 != 5)) {
      if (uVar5 != 7) {
        __assert_fail("Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                      ,0x1ef,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
      }
      iVar6 = Abc_NodeIsTravIdCurrent(p_00);
      if (iVar6 == 0) {
        uVar7 = *(uint *)pCut >> 0xc & 0x3f;
        uVar5 = p->pPars->nLutsOver;
        if (uVar7 == uVar5) {
          return;
        }
        if ((int)uVar5 <= (int)uVar7) {
          __assert_fail("(int)pCut->nNodesDup < p->pPars->nLutsOver",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                        ,0x1f7,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
        }
      }
      lVar8 = (long)(p_00->vFanins).nSize;
      if (0 < lVar8) {
        iVar6 = (*(uint *)pCut & 0x3f) - 1;
        lVar14 = 0;
        do {
          uVar5 = *(uint *)((long)p_00->pNtk->vObjs->pArray[(p_00->vFanins).pArray[lVar14]] + 0x10);
          if ((*(uint *)((long)pCut->uSign + (ulong)(uVar5 >> 3 & 4)) >> (uVar5 & 0x1f) & 1) == 0) {
            if (p->pPars->nVarsMax <= iVar6) {
              return;
            }
            iVar6 = iVar6 + 1;
          }
          lVar14 = lVar14 + 1;
        } while (lVar8 != lVar14);
      }
      lVar8 = (long)p->nCuts;
      if (0x1ff < lVar8) {
        __assert_fail("p->nCuts < LPK_CUTS_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                      ,0x205,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
      }
      pCut_00 = p->pCuts + lVar8;
      uVar7 = *(uint *)pCut_00 & 0xffffffc0;
      *(uint *)pCut_00 = uVar7;
      uVar5 = *(uint *)pCut;
      if ((uVar5 & 0x3f) != 0) {
        uVar11 = 0;
        do {
          iVar6 = pCut->pLeaves[uVar11];
          if (iVar6 != Node) {
            uVar5 = uVar7 & 0x3f;
            uVar7 = uVar7 & 0xffffffc0 | uVar7 + 1 & 0x3f;
            *(uint *)pCut_00 = uVar7;
            p->pCuts[lVar8].pLeaves[uVar5] = iVar6;
            uVar5 = *(uint *)pCut;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < (uVar5 & 0x3f));
      }
      iVar6 = (p_00->vFanins).nSize;
      if (0 < iVar6) {
        lVar14 = 0;
        do {
          pvVar4 = p_00->pNtk->vObjs->pArray[(p_00->vFanins).pArray[lVar14]];
          uVar5 = uVar7 & 0x3f;
          if (uVar5 == 0) {
            uVar11 = 0;
            if (p->pPars->nVarsMax == 0) {
              return;
            }
          }
          else {
            iVar1 = *(int *)((long)pvVar4 + 0x10);
            uVar11 = 0;
            do {
              if (iVar1 <= p->pCuts[lVar8].pLeaves[uVar11]) {
                if (p->pCuts[lVar8].pLeaves[uVar11] != iVar1) goto LAB_00475812;
                goto LAB_0047586a;
              }
              uVar11 = uVar11 + 1;
            } while (uVar5 != uVar11);
            uVar11 = (ulong)uVar5;
LAB_00475812:
            if (uVar5 == p->pPars->nVarsMax) {
              return;
            }
            if ((int)uVar11 < (int)uVar5) {
              uVar9 = (ulong)(uVar7 & 0x3f);
              do {
                p->pCuts[lVar8].pLeaves[uVar9] = p->pCuts[lVar8].pLeaves[uVar9 - 1];
                uVar9 = uVar9 - 1;
              } while ((long)(int)uVar11 < (long)uVar9);
              uVar7 = *(uint *)pCut_00;
            }
          }
          p->pCuts[lVar8].pLeaves[uVar11 & 0xffffffff] = *(int *)((long)pvVar4 + 0x10);
          uVar5 = uVar7 + 1 & 0x3f;
          uVar7 = uVar7 & 0xffffffc0 | uVar5;
          *(uint *)pCut_00 = uVar7;
          if (0x18 < uVar5) {
            __assert_fail("pCutNew->nLeaves <= LPK_SIZE_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                          ,0x21d,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
          }
          iVar6 = (p_00->vFanins).nSize;
LAB_0047586a:
          lVar14 = lVar14 + 1;
        } while (lVar14 < iVar6);
      }
      Lpk_NodeCutSignature(pCut_00);
      iVar6 = Lpk_NodeCutsOneFilter(p->pCuts,p->nCuts,pCut_00);
      if (iVar6 == 0) {
        uVar5 = *(uint *)pCut >> 6 & 0x3f;
        if (0x17 < uVar5) {
          __assert_fail("pCut->nNodes < LPK_SIZE_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                        ,0x226,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
        }
        __dest = p->pCuts[lVar8].pNodes;
        memcpy(__dest,pCut->pNodes,(ulong)(uVar5 << 2));
        uVar5 = *(uint *)pCut;
        uVar7 = *(uint *)pCut_00;
        *(uint *)pCut_00 = uVar7 & 0xfffff03f | uVar5 & 0xfc0;
        uVar2 = *(uint *)pCut;
        uVar10 = uVar7 & 0xfffc003f | uVar5 & 0xfc0 | uVar2 & 0x3f000;
        *(uint *)pCut_00 = uVar10;
        uVar13 = uVar5 >> 6 & 0x3f;
        if (uVar13 != 0) {
          uVar11 = 0;
LAB_004758fb:
          if (__dest[uVar11] != Node) goto code_r0x00475902;
          iVar6 = (uVar5 >> 6 & 0x3f) - 1;
          uVar13 = (uint)uVar11;
          if ((int)uVar13 < iVar6) {
            uVar9 = uVar11;
            do {
              uVar11 = uVar9 + 1;
              p->pCuts[lVar8].pNodes[uVar9] = p->pCuts[lVar8].pNodes[uVar9 + 1];
              uVar9 = uVar11;
            } while ((long)uVar11 < (long)iVar6);
          }
          __dest[uVar11 & 0xffffffff] = Node;
          goto LAB_00475954;
        }
        uVar13 = 0;
LAB_00475954:
        uVar12 = uVar5 >> 6 & 0x3f;
        if (uVar13 == uVar12) {
          *(uint *)pCut_00 = uVar7 & 0xfffc003f | uVar2 & 0x3f000 | uVar5 + 0x40 & 0xfc0;
          p->pCuts[lVar8].pNodes[uVar12] = Node;
          uVar7 = Abc_NodeIsTravIdCurrent(p_00);
          uVar5 = *(uint *)pCut_00;
          uVar10 = uVar5 & 0xfffc0fff | (uVar7 ^ 1) * 0x1000 + uVar5 & 0x3f000;
          *(uint *)pCut_00 = uVar10;
          uVar12 = uVar5 >> 6 & 0x3f;
        }
        if ((int)((uVar10 >> 0xc & 0x3f) + p->nMffc) < (int)uVar12) {
          __assert_fail("pCutNew->nNodes <= p->nMffc + pCutNew->nNodesDup",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                        ,0x23b,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
        }
        if (0x1ff < p->nCuts) {
          __assert_fail("p->nCuts < LPK_CUTS_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                        ,0x23d,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
        }
        p->nCuts = p->nCuts + 1;
      }
    }
  }
  return;
code_r0x00475902:
  uVar11 = uVar11 + 1;
  if (uVar13 == uVar11) goto LAB_00475954;
  goto LAB_004758fb;
}

Assistant:

void Lpk_NodeCutsOne( Lpk_Man_t * p, Lpk_Cut_t * pCut, int Node )
{
    Lpk_Cut_t * pCutNew;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, j, nLeavesNew;
/*
    printf( "Exploring cut " );
    Lpk_NodePrintCut( p, pCut, 1 );
    printf( "with node %d\n", Node );
*/
    // check if the cut can stand adding one more internal node
    if ( pCut->nNodes == LPK_SIZE_MAX )
        return;

    // if the node is a PI, quit
    pObj = Abc_NtkObj( p->pNtk, Node );
    if ( Abc_ObjIsCi(pObj) )
        return;
    assert( Abc_ObjIsNode(pObj) );
//    assert( Abc_ObjFaninNum(pObj) <= p->pPars->nLutSize );

    // if the node is not in the MFFC, check the limit
    if ( !Abc_NodeIsTravIdCurrent(pObj) )
    {
        if ( (int)pCut->nNodesDup == p->pPars->nLutsOver )
            return;
        assert( (int)pCut->nNodesDup < p->pPars->nLutsOver );
    }

    // check the possibility of adding this node using the signature
    nLeavesNew = pCut->nLeaves - 1;
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        if ( (pCut->uSign[(pFanin->Id & 32) > 0] & (1 << (pFanin->Id & 31))) )
            continue;
        if ( ++nLeavesNew > p->pPars->nVarsMax )
            return;
    }

    // initialize the set of leaves to the nodes in the cut
    assert( p->nCuts < LPK_CUTS_MAX );
    pCutNew = p->pCuts + p->nCuts;
    pCutNew->nLeaves = 0;
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        if ( pCut->pLeaves[i] != Node )
            pCutNew->pLeaves[pCutNew->nLeaves++] = pCut->pLeaves[i];

    // add new nodes
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        // find the place where this node belongs
        for ( k = 0; k < (int)pCutNew->nLeaves; k++ )
            if ( pCutNew->pLeaves[k] >= pFanin->Id )
                break;
        if ( k < (int)pCutNew->nLeaves && pCutNew->pLeaves[k] == pFanin->Id )
            continue;
        // check if there is room
        if ( (int)pCutNew->nLeaves == p->pPars->nVarsMax )
            return;
        // move all the nodes
        for ( j = pCutNew->nLeaves; j > k; j-- )
            pCutNew->pLeaves[j] = pCutNew->pLeaves[j-1];
        pCutNew->pLeaves[k] = pFanin->Id;
        pCutNew->nLeaves++;
        assert( pCutNew->nLeaves <= LPK_SIZE_MAX );

    }
    // skip the contained cuts
    Lpk_NodeCutSignature( pCutNew );
    if ( Lpk_NodeCutsOneFilter( p->pCuts, p->nCuts, pCutNew ) )
        return;

    // update the set of internal nodes
    assert( pCut->nNodes < LPK_SIZE_MAX );
    memcpy( pCutNew->pNodes, pCut->pNodes, pCut->nNodes * sizeof(int) );
    pCutNew->nNodes = pCut->nNodes;
    pCutNew->nNodesDup = pCut->nNodesDup;

    // check if the node is already there
    // if so, move the node to be the last
    for ( i = 0; i < (int)pCutNew->nNodes; i++ )
        if ( pCutNew->pNodes[i] == Node )
        {
            for ( k = i; k < (int)pCutNew->nNodes - 1; k++ )
                pCutNew->pNodes[k] = pCutNew->pNodes[k+1];
            pCutNew->pNodes[k] = Node;
            break;
        }
    if ( i == (int)pCutNew->nNodes ) // new node
    {
        pCutNew->pNodes[ pCutNew->nNodes++ ] = Node;
        pCutNew->nNodesDup += !Abc_NodeIsTravIdCurrent(pObj);
    }
    // the number of nodes does not exceed MFFC plus duplications
    assert( pCutNew->nNodes <= p->nMffc + pCutNew->nNodesDup );
    // add the cut to storage
    assert( p->nCuts < LPK_CUTS_MAX );
    p->nCuts++;
}